

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

int i4_gcd(int i,int j)

{
  int iVar1;
  int i2;
  undefined4 local_1c;
  int ir;
  int iq;
  int ip;
  int j_local;
  int i_local;
  
  if (i == 0) {
    if (j < 1) {
      j = -j;
    }
    j_local = i4_max(1,j);
  }
  else if (j == 0) {
    if (i < 1) {
      i = -i;
    }
    j_local = i4_max(1,i);
  }
  else {
    iVar1 = i;
    if (i < 1) {
      iVar1 = -i;
    }
    i2 = j;
    if (j < 1) {
      i2 = -j;
    }
    ir = i4_max(iVar1,i2);
    if (i < 1) {
      i = -i;
    }
    if (j < 1) {
      j = -j;
    }
    local_1c = i4_min(i,j);
    while (iVar1 = ir % local_1c, iVar1 != 0) {
      ir = local_1c;
      local_1c = iVar1;
    }
    j_local = local_1c;
  }
  return j_local;
}

Assistant:

int i4_gcd ( int i, int j )

//****************************************************************************80
//
//  Purpose:
//
//    I4_GCD finds the greatest common divisor of two I4's.
//
//  Discussion:
//
//    Only the absolute values of I and J are
//    considered, so that the result is always nonnegative.
//
//    If I or J is 0, I4_GCD is returned as max ( 1, abs ( I ), abs ( J ) ).
//
//    If I and J have no common factor, I4_GCD is returned as 1.
//
//    Otherwise, using the Euclidean algorithm, I4_GCD is the
//    largest common factor of I and J.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, J, two numbers whose greatest common divisor
//    is desired.
//
//    Output, int I4_GCD, the greatest common divisor of I and J.
//
{
  int ip;
  int iq;
  int ir;
//
//  Return immediately if either I or J is zero.
//
  if ( i == 0 )
  {
    return i4_max ( 1, abs ( j ) );
  }
  else if ( j == 0 )
  {
    return i4_max ( 1, abs ( i ) );
  }
//
//  Set IP to the larger of I and J, IQ to the smaller.
//  This way, we can alter IP and IQ as we go.
//
  ip = i4_max ( abs ( i ), abs ( j ) );
  iq = i4_min ( abs ( i ), abs ( j ) );
//
//  Carry out the Euclidean algorithm.
//
  for ( ; ; )
  {
    ir = ip % iq;

    if ( ir == 0 )
    {
      break;
    }

    ip = iq;
    iq = ir;
  }

  return iq;
}